

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O2

void phmap::priv::
     Deallocate<8ul,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int_const,phmap::priv::(anonymous_namespace)::ParallelFlatHashMap_StandardLayout_Test::TestBody()::Int>>>
               (allocator<std::pair<const_Int,_Int>_> *alloc,void *p,size_t n)

{
  if (p != (void *)0x0) {
    operator_delete(alloc,(long)p + 7U & 0xfffffffffffffff8);
    return;
  }
  __assert_fail("n && \"n must be positive\"",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0x106f,
                "void phmap::priv::Deallocate(Alloc *, void *, size_t) [Alignment = 8UL, Alloc = std::allocator<std::pair<const Int, Int>>]"
               );
}

Assistant:

void Deallocate(Alloc* alloc, void* p, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  struct alignas(Alignment) M {};
  using A = typename phmap::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename phmap::allocator_traits<Alloc>::template rebind_traits<M>;
  A mem_alloc(*alloc);
  AT::deallocate(mem_alloc, static_cast<M*>(p),
                 (n + sizeof(M) - 1) / sizeof(M));
}